

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int ChooseLeaf(Rtree *pRtree,RtreeCell *pCell,int iHeight,RtreeNode **ppLeaf)

{
  RtreeDValue RVar1;
  RtreeDValue RVar2;
  double dVar3;
  double dVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  RtreeNode *iNode;
  uint iCell;
  RtreeNode *pChild;
  RtreeCell cell;
  RtreeNode *local_e0;
  double local_c8;
  RtreeNode *local_a0;
  RtreeCell local_98;
  RtreeCell local_60;
  
  local_a0 = (RtreeNode *)0x0;
  iVar6 = nodeAcquire(pRtree,1,(RtreeNode *)0x0,&local_a0);
  local_e0 = local_a0;
  if ((iVar6 == 0) && (iHeight < pRtree->iDepth)) {
    iVar7 = 0;
    do {
      uVar5 = *(ushort *)(local_e0->zData + 2) << 8 | *(ushort *)(local_e0->zData + 2) >> 8;
      if (uVar5 == 0) {
        iNode = (RtreeNode *)0x0;
      }
      else {
        local_c8 = 0.0;
        iCell = 0;
        iNode = (RtreeNode *)0x0;
        dVar4 = 0.0;
        do {
          nodeGetCell(pRtree,local_e0,iCell,&local_60);
          local_98.aCoord[6] = local_60.aCoord[6];
          local_98.aCoord[7] = local_60.aCoord[7];
          local_98.aCoord[8] = local_60.aCoord[8];
          local_98.aCoord[9] = local_60.aCoord[9];
          local_98.aCoord[2] = local_60.aCoord[2];
          local_98.aCoord[3] = local_60.aCoord[3];
          local_98.aCoord[4] = local_60.aCoord[4];
          local_98.aCoord[5] = local_60.aCoord[5];
          local_98.iRowid = local_60.iRowid;
          local_98.aCoord[0] = local_60.aCoord[0];
          local_98.aCoord[1] = local_60.aCoord[1];
          RVar1 = cellArea(pRtree,&local_98);
          cellUnion(pRtree,&local_98,pCell);
          RVar2 = cellArea(pRtree,&local_98);
          dVar3 = RVar2 - RVar1;
          RVar1 = cellArea(pRtree,&local_60);
          if ((iCell == 0) || (dVar3 < dVar4)) {
LAB_001cc4a0:
            iNode = (RtreeNode *)local_60.iRowid;
            local_c8 = RVar1;
            dVar4 = dVar3;
          }
          else if ((dVar3 == dVar4) && ((!NAN(dVar3) && !NAN(dVar4) && (RVar1 < local_c8))))
          goto LAB_001cc4a0;
          iCell = iCell + 1;
        } while (uVar5 != iCell);
      }
      iVar6 = nodeAcquire(pRtree,(i64)iNode,local_e0,(RtreeNode **)&local_98);
      nodeRelease(pRtree,local_e0);
      local_e0 = (RtreeNode *)local_98.iRowid;
    } while ((iVar6 == 0) && (iVar7 = iVar7 + 1, iVar7 < pRtree->iDepth - iHeight));
  }
  *ppLeaf = local_e0;
  return iVar6;
}

Assistant:

static int ChooseLeaf(
  Rtree *pRtree,               /* Rtree table */
  RtreeCell *pCell,            /* Cell to insert into rtree */
  int iHeight,                 /* Height of sub-tree rooted at pCell */
  RtreeNode **ppLeaf           /* OUT: Selected leaf page */
){
  int rc;
  int ii;
  RtreeNode *pNode = 0;
  rc = nodeAcquire(pRtree, 1, 0, &pNode);

  for(ii=0; rc==SQLITE_OK && ii<(pRtree->iDepth-iHeight); ii++){
    int iCell;
    sqlite3_int64 iBest = 0;

    RtreeDValue fMinGrowth = RTREE_ZERO;
    RtreeDValue fMinArea = RTREE_ZERO;

    int nCell = NCELL(pNode);
    RtreeCell cell;
    RtreeNode *pChild;

    RtreeCell *aCell = 0;

    /* Select the child node which will be enlarged the least if pCell
    ** is inserted into it. Resolve ties by choosing the entry with
    ** the smallest area.
    */
    for(iCell=0; iCell<nCell; iCell++){
      int bBest = 0;
      RtreeDValue growth;
      RtreeDValue area;
      nodeGetCell(pRtree, pNode, iCell, &cell);
      growth = cellGrowth(pRtree, &cell, pCell);
      area = cellArea(pRtree, &cell);
      if( iCell==0||growth<fMinGrowth||(growth==fMinGrowth && area<fMinArea) ){
        bBest = 1;
      }
      if( bBest ){
        fMinGrowth = growth;
        fMinArea = area;
        iBest = cell.iRowid;
      }
    }

    sqlite3_free(aCell);
    rc = nodeAcquire(pRtree, iBest, pNode, &pChild);
    nodeRelease(pRtree, pNode);
    pNode = pChild;
  }

  *ppLeaf = pNode;
  return rc;
}